

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O0

bool __thiscall TRM::TGAImage::write_tga_file(TGAImage *this,char *filename,bool rle)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  undefined1 local_26a [2];
  undefined1 local_268;
  TGAHeader header;
  ofstream local_248 [8];
  ofstream out;
  char acStack_48 [8];
  uchar footer [18];
  undefined4 local_2c;
  undefined4 local_28;
  uchar extension_area_ref [4];
  uchar developer_area_ref [4];
  bool rle_local;
  char *filename_local;
  TGAImage *this_local;
  
  local_28 = 0;
  local_2c = 0;
  builtin_strncpy(acStack_48,"TRUEVISI",8);
  builtin_memcpy(footer,"ON-XFILE.",10);
  extension_area_ref[3] = rle;
  std::ofstream::ofstream(local_248);
  std::ofstream::open((char *)local_248,(_Ios_Openmode)filename);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"can\'t open file ");
    poVar3 = std::operator<<(poVar3,filename);
    std::operator<<(poVar3,"\n");
    std::ofstream::close();
    this_local._7_1_ = false;
  }
  else {
    memset(local_26a,0,0x12);
    header.x_origin._0_1_ = (undefined1)(this->bytespp << 3);
    header._4_2_ = SUB42(this->width,0);
    header._6_2_ = SUB42(this->height,0);
    if (this->bytespp == 1) {
      local_268 = 3;
      if ((extension_area_ref[3] & 1) != 0) {
        local_268 = 0xb;
      }
    }
    else {
      local_268 = 2;
      if ((extension_area_ref[3] & 1) != 0) {
        local_268 = 10;
      }
    }
    header.x_origin._1_1_ = 0x20;
    std::ostream::write((char *)local_248,(long)local_26a);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      std::ofstream::close();
      std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
      this_local._7_1_ = false;
    }
    else {
      if ((extension_area_ref[3] & 1) == 0) {
        std::ostream::write((char *)local_248,(long)this->data);
        bVar1 = std::ios::good();
        if ((bVar1 & 1) == 0) {
          std::operator<<((ostream *)&std::cerr,"can\'t unload raw data\n");
          std::ofstream::close();
          this_local._7_1_ = false;
          goto LAB_00106d3e;
        }
      }
      else {
        bVar2 = unload_rle_data(this,local_248);
        if (!bVar2) {
          std::ofstream::close();
          std::operator<<((ostream *)&std::cerr,"can\'t unload rle data\n");
          this_local._7_1_ = false;
          goto LAB_00106d3e;
        }
      }
      std::ostream::write((char *)local_248,(long)&local_28);
      bVar1 = std::ios::good();
      if ((bVar1 & 1) == 0) {
        std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
        std::ofstream::close();
        this_local._7_1_ = false;
      }
      else {
        std::ostream::write((char *)local_248,(long)&local_2c);
        bVar1 = std::ios::good();
        if ((bVar1 & 1) == 0) {
          std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
          std::ofstream::close();
          this_local._7_1_ = false;
        }
        else {
          std::ostream::write((char *)local_248,(long)acStack_48);
          bVar1 = std::ios::good();
          if ((bVar1 & 1) == 0) {
            std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
            std::ofstream::close();
            this_local._7_1_ = false;
          }
          else {
            std::ofstream::close();
            this_local._7_1_ = true;
          }
        }
      }
    }
  }
LAB_00106d3e:
  header.y_origin = 1;
  header.width = 0;
  std::ofstream::~ofstream(local_248);
  return this_local._7_1_;
}

Assistant:

bool TGAImage::write_tga_file(const char *filename, bool rle) {
  unsigned char developer_area_ref[4] = {0, 0, 0, 0};
  unsigned char extension_area_ref[4] = {0, 0, 0, 0};
  unsigned char footer[18] = {'T', 'R', 'U', 'E', 'V', 'I', 'S', 'I', 'O',
                              'N', '-', 'X', 'F', 'I', 'L', 'E', '.', '\0'};
  std::ofstream out;
  out.open(filename, std::ios::binary);
  if (!out.is_open()) {
    std::cerr << "can't open file " << filename << "\n";
    out.close();
    return false;
  }
  TGAHeader header;
  memset((void *)&header, 0, sizeof(header));
  header.bitsperpixel = bytespp << 3;
  header.width = width;
  header.height = height;
  header.datatypecode =
      (bytespp == GRAYSCALE ? (rle ? 11 : 3) : (rle ? 10 : 2));
  header.imagedescriptor = 0x20;  // top-left origin
  out.write((char *)&header, sizeof(header));
  if (!out.good()) {
    out.close();
    std::cerr << "can't dump the tga file\n";
    return false;
  }
  if (!rle) {
    out.write((char *)data, width * height * bytespp);
    if (!out.good()) {
      std::cerr << "can't unload raw data\n";
      out.close();
      return false;
    }
  } else {
    if (!unload_rle_data(out)) {
      out.close();
      std::cerr << "can't unload rle data\n";
      return false;
    }
  }
  out.write((char *)developer_area_ref, sizeof(developer_area_ref));
  if (!out.good()) {
    std::cerr << "can't dump the tga file\n";
    out.close();
    return false;
  }
  out.write((char *)extension_area_ref, sizeof(extension_area_ref));
  if (!out.good()) {
    std::cerr << "can't dump the tga file\n";
    out.close();
    return false;
  }
  out.write((char *)footer, sizeof(footer));
  if (!out.good()) {
    std::cerr << "can't dump the tga file\n";
    out.close();
    return false;
  }
  out.close();
  return true;
}